

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::VarExpr<(wabt::ExprType)43>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)43>_>_>
 __thiscall wabt::MakeUnique<wabt::VarExpr<(wabt::ExprType)43>,wabt::Var>(wabt *this,Var *args)

{
  Var *var;
  VarExpr<(wabt::ExprType)43> *this_00;
  Location local_38;
  Var *local_18;
  Var *args_local;
  
  local_18 = args;
  args_local = (Var *)this;
  this_00 = (VarExpr<(wabt::ExprType)43> *)operator_new(0x88);
  var = local_18;
  Location::Location(&local_38);
  VarExpr<(wabt::ExprType)43>::VarExpr(this_00,var,&local_38);
  std::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)43>,std::default_delete<wabt::VarExpr<(wabt::ExprType)43>>>
  ::unique_ptr<std::default_delete<wabt::VarExpr<(wabt::ExprType)43>>,void>
            ((unique_ptr<wabt::VarExpr<(wabt::ExprType)43>,std::default_delete<wabt::VarExpr<(wabt::ExprType)43>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)43>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)43>_>,_true,_true>
          )(__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)43>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)43>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}